

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128LowerShift(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  Opnd *this_01;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegNum RVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  RegOpnd *dstOpnd;
  RegOpnd *pRVar8;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  Opnd *pOVar9;
  IntConstOpnd *pIVar10;
  Instr *pIVar11;
  intptr_t iVar12;
  MemRefOpnd *pMVar13;
  IndirOpnd *src1Opnd;
  OpCode opcode;
  IntConstType value;
  OpCode OVar14;
  Func *func;
  
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  pOVar9 = instr->m_src2;
  OVar2 = IR::Opnd::GetKind(this_00);
  if ((OVar2 != OpndKindReg) || (bVar3 = IRType_IsSimd128(this_00->m_type), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x44f,"(dst->IsRegOpnd() && dst->IsSimd128())",
                       "dst->IsRegOpnd() && dst->IsSimd128()");
    if (!bVar3) goto LAB_00677705;
    *puVar5 = 0;
  }
  OVar2 = IR::Opnd::GetKind(this_01);
  if ((OVar2 != OpndKindReg) || (bVar3 = IRType_IsSimd128(this_01->m_type), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x450,"(src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar3) goto LAB_00677705;
    *puVar5 = 0;
  }
  if (pOVar9->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x451,"(src2->IsInt32())","src2->IsInt32()");
    if (!bVar3) goto LAB_00677705;
    *puVar5 = 0;
  }
  OVar14 = instr->m_opcode;
  if (OVar14 < Simd128_ShLtByScalar_I8) {
    value = 0x3f;
    if (OVar14 < Simd128_ShRtByScalar_I2) {
      if (OVar14 == Simd128_ShLtByScalar_I4) {
LAB_00676ebe:
        opcode = PSLLD;
      }
      else {
        if (OVar14 != Simd128_ShRtByScalar_I4) {
          opcode = PSLLQ;
          if (OVar14 != Simd128_ShLtByScalar_I2) goto LAB_00677285;
          goto LAB_00676ed8;
        }
        opcode = PSRAD;
      }
LAB_00676ed3:
      value = 0x1f;
    }
    else {
      if (OVar14 - 0x300 < 2) goto LAB_00676e9b;
      if (OVar14 == Simd128_ShRtByScalar_I2) {
        EmitShiftByScalarI2(this,instr,HelperSimd128ShRtByScalarI2);
        goto LAB_00677067;
      }
      if (OVar14 != Simd128_ShRtByScalar_U2) goto LAB_00677285;
      opcode = PSRLQ;
    }
  }
  else {
    if (OVar14 < Simd128_ShLtByScalar_U8) {
      if (OVar14 < Simd128_ShLtByScalar_U4) {
        if (OVar14 == Simd128_ShLtByScalar_I8) {
LAB_00676ec4:
          opcode = PSLLW;
        }
        else {
          if (OVar14 != Simd128_ShRtByScalar_I8) goto LAB_00677285;
          opcode = PSRAW;
        }
LAB_00676ec8:
        value = 0xf;
        goto LAB_00676ed8;
      }
      if (OVar14 == Simd128_ShLtByScalar_U4) goto LAB_00676ebe;
      if (OVar14 == Simd128_ShRtByScalar_U4) {
        opcode = PSRLD;
        goto LAB_00676ed3;
      }
    }
    else {
      if (OVar14 - 0x3a4 < 2) {
LAB_00676e9b:
        opcode = PSLLD;
        value = 7;
        goto LAB_00676ed8;
      }
      if (OVar14 == Simd128_ShLtByScalar_U8) goto LAB_00676ec4;
      if (OVar14 == Simd128_ShRtByScalar_U8) {
        opcode = PSRLW;
        goto LAB_00676ec8;
      }
    }
LAB_00677285:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x484,"((0))","UNREACHED");
    if (!bVar3) goto LAB_00677705;
    *puVar5 = 0;
    opcode = PSLLD;
    value = 0xffffffff;
  }
LAB_00676ed8:
  pRVar6 = IR::RegOpnd::New(TyInt32,this->m_func);
  pRVar7 = IR::RegOpnd::New(TyInt32,this->m_func);
  dstOpnd = IR::RegOpnd::New(this_01->m_type,this->m_func);
  pRVar8 = IR::RegOpnd::New(this_01->m_type,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(this_01->m_type,this->m_func);
  dstOpnd_01 = IR::RegOpnd::New(pOVar9->m_type,this->m_func);
  pOVar9 = EnregisterIntConst(this,instr,pOVar9,TyInt32);
  pIVar10 = IR::IntConstOpnd::New(value,TyInt32,this->m_func,false);
  pIVar11 = IR::Instr::New(AND,&dstOpnd_01->super_Opnd,pOVar9,&pIVar10->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar11);
  Legalize<false>(pIVar11,false);
  pIVar11 = IR::Instr::New(MOVD,&dstOpnd->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar11);
  OVar14 = instr->m_opcode;
  if (OVar14 < Simd128_ShLtByScalar_I8) {
    if ((OVar14 - 0x2aa < 0x29) && ((0x14000000003U >> ((ulong)(OVar14 - 0x2aa) & 0x3f) & 1) != 0))
    goto LAB_00677035;
    if (OVar14 != Simd128_ShLtByScalar_I16) goto LAB_00677208;
LAB_00677091:
    pIVar11 = IR::Instr::New(MOVAPS,&pRVar8->super_Opnd,this_01,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    pIVar11 = IR::Instr::New(MOVAPS,this_00,this_01,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    iVar12 = ThreadContextInfo::GetX86HighBytesMaskAddr(this->m_func->m_threadContextInfo);
    pMVar13 = IR::MemRefOpnd::New(iVar12,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
    pIVar11 = IR::Instr::New(PAND,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pMVar13->super_Opnd,
                             this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(PSLLW,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&dstOpnd->super_Opnd,
                             this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(PSLLW,this_00,this_00,&dstOpnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    iVar12 = ThreadContextInfo::GetX86LowBytesMaskAddr(this->m_func->m_threadContextInfo);
    pMVar13 = IR::MemRefOpnd::New(iVar12,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
    pIVar11 = IR::Instr::New(PAND,this_00,this_00,&pMVar13->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    func = this->m_func;
    OVar14 = POR;
  }
  else {
    if (((OVar14 - 0x366 < 0x1d) && ((0x18000003U >> (OVar14 - 0x366 & 0x1f) & 1) != 0)) ||
       (OVar14 - 0x33e < 2)) {
LAB_00677035:
      pIVar11 = IR::Instr::New(opcode,this_00,this_01,&dstOpnd->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      goto LAB_00677067;
    }
LAB_00677208:
    if (OVar14 == Simd128_ShRtByScalar_I16) {
      pIVar11 = IR::Instr::New(MOVAPS,&pRVar8->super_Opnd,this_01,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(MOVAPS,this_00,this_01,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar10 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
      pIVar11 = IR::Instr::New(PSLLW,this_00,this_00,&pIVar10->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pRVar7 = IR::Opnd::AsRegOpnd(&dstOpnd_01->super_Opnd);
      src1Opnd = IR::IndirOpnd::New(pRVar7,8,TyInt32,this->m_func,false);
      pIVar11 = IR::Instr::New(LEA,&pRVar6->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(MOVD,&dstOpnd_00->super_Opnd,&pRVar6->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(PSRAW,this_00,this_00,&dstOpnd_00->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      iVar12 = ThreadContextInfo::GetX86LowBytesMaskAddr(this->m_func->m_threadContextInfo);
      pMVar13 = IR::MemRefOpnd::New(iVar12,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
      pIVar11 = IR::Instr::New(PAND,this_00,this_00,&pMVar13->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      pIVar11 = IR::Instr::New(PSRAW,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&dstOpnd->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      iVar12 = ThreadContextInfo::GetX86HighBytesMaskAddr(this->m_func->m_threadContextInfo);
      pMVar13 = IR::MemRefOpnd::New(iVar12,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
      pIVar11 = IR::Instr::New(PAND,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pMVar13->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      func = this->m_func;
      OVar14 = POR;
    }
    else {
      if (OVar14 != Simd128_ShRtByScalar_U16) {
        if (OVar14 != Simd128_ShLtByScalar_U16) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x50e,"((0))","UNREACHED");
          if (!bVar3) {
LAB_00677705:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          goto LAB_00677067;
        }
        goto LAB_00677091;
      }
      pRVar6 = IR::RegOpnd::New(TyInt8,this->m_func);
      RVar4 = LowererMDArch::GetRegShiftCount();
      pRVar6->m_reg = RVar4;
      pRVar8 = IR::RegOpnd::New(TyInt8,this->m_func);
      pIVar11 = IR::Instr::New(MOVAPS,this_00,this_01,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar10 = IR::IntConstOpnd::New(0xff,TyInt32,this->m_func,false);
      pIVar11 = IR::Instr::New(MOV,&pRVar7->super_Opnd,&pIVar10->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(MOV,&pRVar6->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(SHR,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pRVar6->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(MOV,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      pIVar11 = IR::Instr::New(MOVSX,&pRVar7->super_Opnd,&pRVar8->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pRVar8 = IR::RegOpnd::New(TySimd128I4,this->m_func);
      pIVar11 = IR::Instr::New(PSRLW,this_00,this_00,&dstOpnd->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(MOVD,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      pIVar11 = IR::Instr::New(PUNPCKLBW,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pRVar8->super_Opnd
                               ,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      pIVar11 = IR::Instr::New(PUNPCKLWD,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pRVar8->super_Opnd
                               ,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      pIVar10 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,true);
      pIVar11 = IR::Instr::New(PSHUFD,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pIVar10->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      func = this->m_func;
      OVar14 = PAND;
    }
  }
  pIVar11 = IR::Instr::New(OVar14,this_00,this_00,&pRVar8->super_Opnd,func);
  IR::Instr::InsertBefore(instr,pIVar11);
LAB_00677067:
  pIVar11 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar11;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerShift(IR::Instr *instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(dst->IsRegOpnd() && dst->IsSimd128());
    Assert(src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2->IsInt32());

    Js::OpCode opcode = Js::OpCode::PSLLD;
    int elementSizeInBytes = 0;

    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_ShRtByScalar_I2:
        EmitShiftByScalarI2(instr, IR::HelperSimd128ShRtByScalarI2);
        return removeInstr(instr);
    case Js::OpCode::Simd128_ShLtByScalar_I2:
        opcode = Js::OpCode::PSLLQ;
        elementSizeInBytes = 8;
        break;
    case Js::OpCode::Simd128_ShRtByScalar_U2:
        opcode = Js::OpCode::PSRLQ;
        elementSizeInBytes = 8;
        break;
    case Js::OpCode::Simd128_ShLtByScalar_I4:
    case Js::OpCode::Simd128_ShLtByScalar_U4:    // same as int32x4.ShiftLeftScalar
        opcode = Js::OpCode::PSLLD;
        elementSizeInBytes = 4;
        break;
    case Js::OpCode::Simd128_ShRtByScalar_I4:
        opcode = Js::OpCode::PSRAD;
        elementSizeInBytes = 4;
        break;
    case Js::OpCode::Simd128_ShLtByScalar_I8:
    case Js::OpCode::Simd128_ShLtByScalar_U8:    // same as int16x8.ShiftLeftScalar
        opcode = Js::OpCode::PSLLW;
        elementSizeInBytes = 2;
        break;
    case Js::OpCode::Simd128_ShRtByScalar_I8:
        opcode = Js::OpCode::PSRAW;
        elementSizeInBytes = 2;
        break;
    case Js::OpCode::Simd128_ShRtByScalar_U4:
        opcode = Js::OpCode::PSRLD;
        elementSizeInBytes = 4;
        break;
    case Js::OpCode::Simd128_ShRtByScalar_U8:
        opcode = Js::OpCode::PSRLW;
        elementSizeInBytes = 2;
        break;
    case Js::OpCode::Simd128_ShLtByScalar_I16:   // composite, int8x16.ShiftLeftScalar
    case Js::OpCode::Simd128_ShRtByScalar_I16:   // composite, int8x16.ShiftRightScalar
    case Js::OpCode::Simd128_ShLtByScalar_U16:   // same as int8x16.ShiftLeftScalar
    case Js::OpCode::Simd128_ShRtByScalar_U16:   // composite, uint8x16.ShiftRightScalar
        elementSizeInBytes = 1;
        break;
    default:
        Assert(UNREACHED);
    }

    IR::Instr *pInstr = nullptr;
    IR::RegOpnd *reg  = IR::RegOpnd::New(TyInt32, m_func);
    IR::RegOpnd *reg2 = IR::RegOpnd::New(TyInt32, m_func);
    IR::RegOpnd *tmp0 = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::RegOpnd *tmp1 = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::RegOpnd *tmp2 = IR::RegOpnd::New(src1->GetType(), m_func);

    //Shift amount: The shift amount is masked by [ElementSize] * 8
    //The masked Shift amount is moved to xmm register
    //AND  shamt, shmask, shamt
    //MOVD tmp0, shamt

    IR::RegOpnd *shamt = IR::RegOpnd::New(src2->GetType(), m_func);
    // en-register
    IR::Opnd *origShamt = EnregisterIntConst(instr, src2); //unnormalized shift amount
    pInstr = IR::Instr::New(Js::OpCode::AND, shamt, origShamt, IR::IntConstOpnd::New(Js::SIMDUtils::SIMDGetShiftAmountMask(elementSizeInBytes), TyInt32, m_func), m_func); // normalizing by elm width (i.e. shamt % elm_width)
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    pInstr = IR::Instr::New(Js::OpCode::MOVD, tmp0, shamt, m_func);
    instr->InsertBefore(pInstr);


    if (instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_I4 || instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_U4 || instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_I8 || instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_U8 || instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_I2 || instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_U2)
    {
        // shiftOpCode dst, src1, tmp0
        pInstr = IR::Instr::New(opcode, dst, src1, tmp0, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
    }
    else if (instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_I16 || instr->m_opcode == Js::OpCode::Simd128_ShLtByScalar_U16)
    {
        // MOVAPS tmp1, src1
        pInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp1, src1, m_func);
        instr->InsertBefore(pInstr);
        // MOVAPS dst, src1
        pInstr = IR::Instr::New(Js::OpCode::MOVAPS, dst, src1, m_func);
        instr->InsertBefore(pInstr);
        // PAND     tmp1, [X86_HIGHBYTES_MASK]
        pInstr = IR::Instr::New(Js::OpCode::PAND, tmp1, tmp1, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86HighBytesMaskAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PSLLW  tmp1, tmp0
        pInstr = IR::Instr::New(Js::OpCode::PSLLW, tmp1, tmp1, tmp0, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PSLLW  dst, tmp0
        pInstr = IR::Instr::New(Js::OpCode::PSLLW, dst, dst, tmp0, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PAND   dst, [X86_LOWBYTES_MASK]
        pInstr = IR::Instr::New(Js::OpCode::PAND, dst, dst, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86LowBytesMaskAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // POR    dst,  tmp1
        pInstr = IR::Instr::New(Js::OpCode::POR, dst, dst, tmp1, m_func);
        instr->InsertBefore(pInstr);
    }
    else if (instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_I16)
    {
        // MOVAPS   tmp1, src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVAPS, tmp1, src1, m_func));
        // MOVAPS   dst, src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVAPS, dst, src1, m_func));
        // PSLLW    dst, 8
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PSLLW, dst, dst, IR::IntConstOpnd::New(8, TyInt8, m_func), m_func));
        // LEA      reg, [shamt + 8]
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(shamt->AsRegOpnd(), +8, TyInt32, m_func);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::LEA, reg, indirOpnd, m_func));
        // MOVD   tmp0, reg
        pInstr = IR::Instr::New(Js::OpCode::MOVD, tmp2, reg, m_func);
        instr->InsertBefore(pInstr);
        // PSRAW    dst, tmp0
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PSRAW, dst, dst, tmp2, m_func));
        // PAND     dst, [X86_LOWBYTES_MASK]
        pInstr = IR::Instr::New(Js::OpCode::PAND, dst, dst, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86LowBytesMaskAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PSRAW    tmp1, tmp0
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PSRAW, tmp1, tmp1, tmp0, m_func));
        // PAND     tmp1, [X86_HIGHBYTES_MASK]
        pInstr = IR::Instr::New(Js::OpCode::PAND, tmp1, tmp1, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86HighBytesMaskAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // POR      dst, tmp1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::POR, dst, dst, tmp1, m_func));
    }
    else if (instr->m_opcode == Js::OpCode::Simd128_ShRtByScalar_U16)
    {
        IR::RegOpnd * shamtReg = IR::RegOpnd::New(TyInt8, m_func);
        shamtReg->SetReg(LowererMDArch::GetRegShiftCount());
        IR::RegOpnd * tmp = IR::RegOpnd::New(TyInt8, m_func);

        // MOVAPS   dst, src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVAPS, dst, src1, m_func));
        // MOV      reg2, 0FFh
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, reg2, IR::IntConstOpnd::New(0xFF, TyInt32, m_func), m_func));
        // MOV      shamtReg, shamt
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, shamtReg, shamt, m_func));
        // SHR      reg2, shamtReg (lower 8 bit)
        instr->InsertBefore(IR::Instr::New(Js::OpCode::SHR, reg2, reg2, shamtReg, m_func));

        // MOV      tmp, reg2
        // MOVSX    reg2, tmp(TyInt8)

        pInstr = IR::Instr::New(Js::OpCode::MOV, tmp, reg2, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSX, reg2, tmp, m_func));
        IR::RegOpnd *mask = IR::RegOpnd::New(TySimd128I4, m_func);
        // PSRLW dst, mask
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PSRLW, dst, dst, tmp0, m_func));
        // splat (0xFF >> shamt) into mask
        // MOVD  mask, reg2
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVD, mask, reg2, m_func));
        // PUNPCKLBW   mask, mask
        pInstr = IR::Instr::New(Js::OpCode::PUNPCKLBW, mask, mask, mask, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PUNPCKLWD   mask, mask
        pInstr = IR::Instr::New(Js::OpCode::PUNPCKLWD, mask, mask, mask, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
        // PSHUFD      mask, mask, 0
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, mask, mask, IR::IntConstOpnd::New(0, TyInt8, m_func, true), m_func));
        // PAND dst, mask
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PAND, dst, dst, mask, m_func));
    }
    else
    {
        Assert(UNREACHED);
    }

    pInstr = instr->m_prev;
    instr->Remove();

    return pInstr;
}